

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::ensureWindowState(QMdiSubWindowPrivate *this,WindowState state)

{
  bool bVar1;
  Int IVar2;
  QWidget *this_00;
  int in_ESI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  WindowStates windowStates;
  WindowState in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<Qt::WindowState,_4> local_1c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_18;
  QFlagsStorageHelper<Qt::WindowState,_4> local_14;
  QFlagsStorageHelper<Qt::WindowState,_4> local_10;
  QFlagsStorage<Qt::WindowState> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_c.i = 0xaaaaaaaa;
  local_10.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)QWidget::windowState(in_stack_ffffffffffffffa0);
  local_c.i = (Int)QFlags<Qt::WindowState>::operator|
                             ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff9c);
  if (in_ESI == 0) {
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-2);
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-3);
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-5);
  }
  else if (in_ESI == 1) {
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-3);
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-5);
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-1);
  }
  else if (in_ESI == 2) {
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-2);
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-5);
    QFlags<Qt::WindowState>::operator&=((QFlags<Qt::WindowState> *)&local_c,-1);
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x630722);
  if (bVar1) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x63073c);
    local_18.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)QWidget::windowState(in_stack_ffffffffffffffa0);
    local_14.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)
         QFlags<Qt::WindowState>::operator&
                   ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_14);
    in_stack_ffffffffffffffaf = false;
    if (bVar1) {
      local_1c.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c
                     );
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
      in_stack_ffffffffffffffaf = IVar2 != 0;
    }
    if ((bool)in_stack_ffffffffffffffaf == false) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6307ef);
      QWidget::overrideWindowState
                ((QWidget *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                 (WindowStates)in_stack_ffffffffffffffbc.i);
    }
    else {
      this_00 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6307b6);
      in_stack_ffffffffffffffbc.i =
           (Int)QFlags<Qt::WindowState>::operator&
                          ((QFlags<Qt::WindowState> *)this_00,in_stack_ffffffffffffff9c);
      QWidget::overrideWindowState
                ((QWidget *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                 (WindowStates)in_stack_ffffffffffffffbc.i);
    }
  }
  QWidget::overrideWindowState
            ((QWidget *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
             (WindowStates)in_stack_ffffffffffffffbc.i);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::ensureWindowState(Qt::WindowState state)
{
    Q_Q(QMdiSubWindow);
    Qt::WindowStates windowStates = q->windowState() | state;
    switch (state) {
    case Qt::WindowMinimized:
        windowStates &= ~Qt::WindowMaximized;
        windowStates &= ~Qt::WindowFullScreen;
        windowStates &= ~Qt::WindowNoState;
        break;
    case Qt::WindowMaximized:
        windowStates &= ~Qt::WindowMinimized;
        windowStates &= ~Qt::WindowFullScreen;
        windowStates &= ~Qt::WindowNoState;
        break;
    case Qt::WindowNoState:
        windowStates &= ~Qt::WindowMinimized;
        windowStates &= ~Qt::WindowMaximized;
        windowStates &= ~Qt::WindowFullScreen;
        break;
    default:
        break;
    }
    if (baseWidget) {
        if (!(baseWidget->windowState() & Qt::WindowActive) && windowStates & Qt::WindowActive)
            baseWidget->overrideWindowState(windowStates & ~Qt::WindowActive);
        else
            baseWidget->overrideWindowState(windowStates);
    }
    q->overrideWindowState(windowStates);
}